

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaModelGroupPtr
xmlSchemaAddModelGroup
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaTypeType type,xmlNodePtr node)

{
  int iVar1;
  xmlSchemaModelGroupPtr item;
  
  if (schema != (xmlSchemaPtr)0x0 && ctxt != (xmlSchemaParserCtxtPtr)0x0) {
    item = (xmlSchemaModelGroupPtr)(*xmlMalloc)(0x28);
    if (item == (xmlSchemaModelGroupPtr)0x0) {
      xmlSchemaPErrMemory(ctxt);
    }
    else {
      *(undefined8 *)item = 0;
      item->annot = (xmlSchemaAnnotPtr)0x0;
      item->next = (xmlSchemaTreeItemPtr_conflict)0x0;
      item->children = (xmlSchemaTreeItemPtr_conflict)0x0;
      item->type = type;
      item->node = node;
      iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->locals,10,item);
      if (-1 < iVar1) {
        if ((type & ~XML_SCHEMA_TYPE_BASIC) != XML_SCHEMA_TYPE_SEQUENCE) {
          return item;
        }
        iVar1 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
        if (-1 < iVar1) {
          return item;
        }
        xmlSchemaPErrMemory(ctxt);
        return item;
      }
      xmlSchemaPErrMemory(ctxt);
      (*xmlFree)(item);
    }
  }
  return (xmlSchemaModelGroupPtr)0x0;
}

Assistant:

static xmlSchemaModelGroupPtr
xmlSchemaAddModelGroup(xmlSchemaParserCtxtPtr ctxt,
		       xmlSchemaPtr schema,
		       xmlSchemaTypeType type,
		       xmlNodePtr node)
{
    xmlSchemaModelGroupPtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaModelGroupPtr)
	xmlMalloc(sizeof(xmlSchemaModelGroup));
    if (ret == NULL) {
	xmlSchemaPErrMemory(ctxt);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaModelGroup));
    ret->type = type;
    ret->node = node;
    WXS_ADD_LOCAL(ctxt, ret);
    if ((type == XML_SCHEMA_TYPE_SEQUENCE) ||
	(type == XML_SCHEMA_TYPE_CHOICE))
	WXS_ADD_PENDING(ctxt, ret);
    return (ret);
}